

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

int __thiscall bdQuery::nextQuery(bdQuery *this,bdId *id,bdNodeId *targetNodeId)

{
  bool bVar1;
  undefined4 uVar2;
  in_addr_t iVar3;
  _Rb_tree_color _Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  time_t tVar15;
  long lVar16;
  _Base_ptr p_Var17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  _Self __tmp;
  bdNodeId midRndId;
  
  if ((this->mState == 2) || ((this->mQueryFlags & 2) != 0)) {
    uVar20 = 0;
    tVar15 = time((time_t *)0x0);
    lVar16 = (tVar15 - this->mQueryTS) / 2;
    if (this->mQueryIdlePeerRetryPeriod < lVar16) {
      iVar12 = (int)lVar16;
      iVar14 = 0x4b0;
      if (iVar12 < 0x4b0) {
        iVar14 = iVar12;
      }
      this->mQueryIdlePeerRetryPeriod = iVar14;
    }
    p_Var17 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar19 = false;
    while ((_Rb_tree_header *)p_Var17 != &(this->mClosest)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(p_Var17 + 3) == 0) {
        bVar1 = true;
      }
      else if ((this->mQueryFlags & 2) == 0) {
        bVar1 = false;
      }
      else {
        bVar1 = (long)this->mQueryIdlePeerRetryPeriod < tVar15 - *(long *)(p_Var17 + 3);
      }
      if (tVar15 - (long)p_Var17[3]._M_parent < 10 || p_Var17[3]._M_parent == (_Base_ptr)0x0) {
        uVar13 = (*this->mFns->_vptr_bdDhtFunctions[2])();
        bVar19 = (bool)(bVar19 | uVar20 < (uVar13 & 0xffff));
      }
      if (bVar1) {
        *(undefined4 *)((id->id).data + 0x10) = *(undefined4 *)&p_Var17[2]._M_right;
        uVar2 = *(undefined4 *)&p_Var17[1]._M_right;
        iVar3 = *(in_addr_t *)((long)&p_Var17[1]._M_right + 4);
        _Var4 = p_Var17[2]._M_color;
        uVar8 = p_Var17[2].field_0x4;
        uVar9 = p_Var17[2].field_0x5;
        uVar10 = p_Var17[2].field_0x6;
        uVar11 = p_Var17[2].field_0x7;
        uVar5 = *(undefined4 *)((long)&p_Var17[2]._M_parent + 4);
        uVar6 = *(undefined4 *)&p_Var17[2]._M_left;
        uVar7 = *(undefined4 *)((long)&p_Var17[2]._M_left + 4);
        *(undefined4 *)(id->id).data = *(undefined4 *)&p_Var17[2]._M_parent;
        *(undefined4 *)((id->id).data + 4) = uVar5;
        *(undefined4 *)((id->id).data + 8) = uVar6;
        *(undefined4 *)((id->id).data + 0xc) = uVar7;
        (id->addr).sin_family = (short)uVar2;
        (id->addr).sin_port = (short)((uint)uVar2 >> 0x10);
        (id->addr).sin_addr.s_addr = iVar3;
        *(_Rb_tree_color *)(id->addr).sin_zero = _Var4;
        (id->addr).sin_zero[4] = uVar8;
        (id->addr).sin_zero[5] = uVar9;
        (id->addr).sin_zero[6] = uVar10;
        (id->addr).sin_zero[7] = uVar11;
        *(time_t *)(p_Var17 + 3) = tVar15;
        if ((this->mQueryFlags & 1) == 0) {
          *(undefined4 *)(targetNodeId->data + 0x10) = *(undefined4 *)((this->mId).data + 0x10);
          midRndId.data._0_4_ = *(undefined4 *)(this->mId).data;
          midRndId.data._4_4_ = *(undefined4 *)((this->mId).data + 4);
          midRndId.data._8_4_ = *(undefined4 *)((this->mId).data + 8);
          midRndId.data._12_4_ = *(undefined4 *)((this->mId).data + 0xc);
        }
        else {
          (*this->mFns->_vptr_bdDhtFunctions[9])(this->mFns,this,&id->id,&midRndId);
          *(undefined4 *)(targetNodeId->data + 0x10) = midRndId.data._16_4_;
        }
        *(undefined4 *)targetNodeId->data = midRndId.data._0_4_;
        *(undefined4 *)(targetNodeId->data + 4) = midRndId.data._4_4_;
        *(undefined4 *)(targetNodeId->data + 8) = midRndId.data._8_4_;
        *(undefined4 *)(targetNodeId->data + 0xc) = midRndId.data._12_4_;
        return 1;
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      uVar20 = uVar20 + 1;
    }
    uVar18 = tVar15 - this->mQueryTS;
    if (9 < (long)uVar18) {
      if ((uVar18 < 0x12d) &&
         (uVar18 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count,
         uVar20 = (*this->mFns->_vptr_bdDhtFunctions[2])(), uVar18 < (uVar20 & 0xffff) || bVar19)) {
        return 0;
      }
      if (this->mState == 2) {
        this->mSearchTime = (int)tVar15 - (int)this->mQueryTS;
      }
      removeOldPotentialPeers(this);
      if ((this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        this->mState = 3;
      }
      else {
        iVar14 = operator==((bdNodeId *)
                            &(this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                             [2]._M_parent,&this->mId);
        if ((iVar14 == 0) ||
           ((this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_parent ==
            (_Base_ptr)0x0)) {
          iVar14 = operator==((bdNodeId *)
                              &(this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left[2]._M_parent,&this->mId);
          if (iVar14 == 0) {
            this->mState = 4;
          }
          else {
            this->mState = 5;
          }
        }
        else {
          this->mState = 6;
        }
      }
    }
  }
  return 0;
}

Assistant:

int bdQuery::nextQuery(bdId &id, bdNodeId &targetNodeId) {
	if ((mState != BITDHT_QUERY_QUERYING) && !(mQueryFlags & BITDHT_QFLAGS_DO_IDLE)) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "NextQuery() Query is done\n");
#endif
		return 0;
	}

	/* search through through list, find closest not queried */
	time_t now = time(NULL);

	/* update IdlePeerRetry */
	if ((now - mQueryTS) / 2 > mQueryIdlePeerRetryPeriod) {
		mQueryIdlePeerRetryPeriod = (now-mQueryTS) / 2;
		if (mQueryIdlePeerRetryPeriod > MAX_QUERY_IDLE_PERIOD) {
			mQueryIdlePeerRetryPeriod = MAX_QUERY_IDLE_PERIOD;
		}
	}

	bool notFinished = false;
	std::multimap<bdMetric, bdPeer>::iterator it;
	int i = 0;
	for (it = mClosest.begin(); it != mClosest.end(); it++, i++) {
		bool queryPeer = false;

		/* if never queried */
		if (it->second.mLastSendTime == 0) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found non-sent peer. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}

		/* re-request every so often */
		if ((!queryPeer) && (mQueryFlags & BITDHT_QFLAGS_DO_IDLE) && 
			(now - it->second.mLastSendTime > mQueryIdlePeerRetryPeriod)) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found out-of-date. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}
		
		/* expecting every peer to be up-to-date is too hard...
		 * enough just to have received lists from each 
		 * - replacement policy will still work.
		 *
		 * Need to wait at least EXPECTED_REPLY, to make sure their answers are pinged
		 */	

		if (((it->second.mLastRecvTime == 0) || (now - it->second.mLastRecvTime < EXPECTED_REPLY)) && 
				(i < mFns->bdNumQueryNodes())) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Never Received @Idx(%d) notFinished = true: ", i);
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			notFinished = true;
		}

		if (queryPeer) {
			id = it->second.mPeerId;
			it->second.mLastSendTime = now;

			if (mQueryFlags & BITDHT_QFLAGS_DISGUISE) {
				/* calc Id mid point between Target and Peer */
				bdNodeId midRndId;
				mFns->bdRandomMidId(&mId, &(id.id), &midRndId);

				targetNodeId = midRndId;
			} else
				targetNodeId = mId;

#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Querying Peer: ");
			mFns->bdPrintId(std::cerr, &id);
			std::cerr << std::endl;
#endif
			return 1;
		}
	}

	/* allow query to run for a minimal amount of time
	 * This is important as startup - when we might not have any peers.	
	 * Probably should be handled elsewhere.
	 */
	time_t age = now - mQueryTS;

	if (age < BITDHT_MIN_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() under Min Time: Query not finished / No Query\n");
#endif
		return 0;
	}

	if (age > BITDHT_MAX_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() over Max Time: Query force to Finish\n");
#endif
		/* fall through and stop */
	} else if ((mClosest.size() < mFns->bdNumQueryNodes()) || (notFinished)) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() notFinished | !size(): Query not finished / No Query\n");
#endif
		/* not full yet... */
		return 0;
	}

#ifdef DEBUG_QUERY 
	fprintf(stderr, "NextQuery() Finished\n");
#endif

	/* if we get here - query finished */
	if (mState == BITDHT_QUERY_QUERYING) {
		/* store query time */
		mSearchTime = now - mQueryTS;
	}

	/* cleanup PotentialPeers before doing the final State */;
	removeOldPotentialPeers();
	/* check if we found the node */
	if (mClosest.size() > 0) {
		if (((mClosest.begin()->second).mPeerId.id == mId) && 
			((mClosest.begin()->second).mLastRecvTime != 0))
			mState = BITDHT_QUERY_SUCCESS;
		else if ((mPotentialPeers.begin()->second).mPeerId.id == mId)
			mState = BITDHT_QUERY_PEER_UNREACHABLE;
		else
			mState = BITDHT_QUERY_FOUND_CLOSEST;
	} else
		mState = BITDHT_QUERY_FAILURE;
	return 0;
}